

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_HANDLE
IoTHubRegistryManager_Create(IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  IOTHUB_SERVICE_CLIENT_AUTH *serviceClientAuth;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_HANDLE result;
  IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle_local;
  
  if (serviceClientHandle == (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_Create",0x502,1,
                "serviceClientHandle input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (serviceClientHandle->hostname == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_Create",0x50b,1,
                "authInfo->hostName input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (serviceClientHandle->iothubName == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_Create",0x510,1,
                "authInfo->iothubName input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (serviceClientHandle->iothubSuffix == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_Create",0x515,1,
                "authInfo->iothubSuffix input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if ((serviceClientHandle->keyName == (char *)0x0) &&
          (serviceClientHandle->deviceId == (char *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_Create",0x51a,1,
                "authInfo->keyName and authInfo->deviceId input parameter cannot both be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (serviceClientHandle->sharedAccessKey == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_Create",0x51f,1,
                "authInfo->sharedAccessKey input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0x30);
    if ((IOTHUB_REGISTRYMANAGER *)l == (IOTHUB_REGISTRYMANAGER *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"IoTHubRegistryManager_Create",0x527,1,"Malloc failed for IOTHUB_REGISTRYMANAGER"
                 );
      }
    }
    else {
      memset(l,0,0x30);
      iVar1 = mallocAndStrcpy_s((char **)l,serviceClientHandle->hostname);
      if (iVar1 == 0) {
        iVar1 = mallocAndStrcpy_s(&((IOTHUB_REGISTRYMANAGER *)l)->iothubName,
                                  serviceClientHandle->iothubName);
        if (iVar1 == 0) {
          iVar1 = mallocAndStrcpy_s(&((IOTHUB_REGISTRYMANAGER *)l)->iothubSuffix,
                                    serviceClientHandle->iothubSuffix);
          if (iVar1 == 0) {
            iVar1 = mallocAndStrcpy_s(&((IOTHUB_REGISTRYMANAGER *)l)->sharedAccessKey,
                                      serviceClientHandle->sharedAccessKey);
            if (iVar1 == 0) {
              if ((serviceClientHandle->keyName == (char *)0x0) ||
                 (iVar1 = mallocAndStrcpy_s(&((IOTHUB_REGISTRYMANAGER *)l)->keyName,
                                            serviceClientHandle->keyName), iVar1 == 0)) {
                if ((serviceClientHandle->deviceId != (char *)0x0) &&
                   (iVar1 = mallocAndStrcpy_s(&((IOTHUB_REGISTRYMANAGER *)l)->deviceId,
                                              serviceClientHandle->deviceId), iVar1 != 0)) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                              ,"IoTHubRegistryManager_Create",0x54d,1,
                              "mallocAndStrcpy_s failed for deviceId");
                  }
                  free_registrymanager_handle((IOTHUB_REGISTRYMANAGER *)l);
                  l = (LOGGER_LOG)0x0;
                }
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"IoTHubRegistryManager_Create",0x547,1,
                            "mallocAndStrcpy_s failed for keyName");
                }
                free_registrymanager_handle((IOTHUB_REGISTRYMANAGER *)l);
                l = (LOGGER_LOG)0x0;
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                          ,"IoTHubRegistryManager_Create",0x541,1,
                          "mallocAndStrcpy_s failed for sharedAccessKey");
              }
              free_registrymanager_handle((IOTHUB_REGISTRYMANAGER *)l);
              l = (LOGGER_LOG)0x0;
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                        ,"IoTHubRegistryManager_Create",0x53b,1,
                        "mallocAndStrcpy_s failed for iothubSuffix");
            }
            free_registrymanager_handle((IOTHUB_REGISTRYMANAGER *)l);
            l = (LOGGER_LOG)0x0;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"IoTHubRegistryManager_Create",0x535,1,
                      "mallocAndStrcpy_s failed for iothubName");
          }
          free_registrymanager_handle((IOTHUB_REGISTRYMANAGER *)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"IoTHubRegistryManager_Create",0x52f,1,"mallocAndStrcpy_s failed for hostName")
          ;
        }
        free_registrymanager_handle((IOTHUB_REGISTRYMANAGER *)l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (IOTHUB_REGISTRYMANAGER_HANDLE)l;
}

Assistant:

IOTHUB_REGISTRYMANAGER_HANDLE IoTHubRegistryManager_Create(IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle)
{
    IOTHUB_REGISTRYMANAGER_HANDLE result;

    if (serviceClientHandle == NULL)
    {
        LogError("serviceClientHandle input parameter cannot be NULL");
        result = NULL;
    }
    else
    {
        IOTHUB_SERVICE_CLIENT_AUTH* serviceClientAuth = (IOTHUB_SERVICE_CLIENT_AUTH*)serviceClientHandle;

        if (serviceClientAuth->hostname == NULL)
        {
            LogError("authInfo->hostName input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->iothubName == NULL)
        {
            LogError("authInfo->iothubName input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->iothubSuffix == NULL)
        {
            LogError("authInfo->iothubSuffix input parameter cannot be NULL");
            result = NULL;
        }
        else if ((serviceClientAuth->keyName == NULL) && (serviceClientAuth->deviceId == NULL))
        {
            LogError("authInfo->keyName and authInfo->deviceId input parameter cannot both be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->sharedAccessKey == NULL)
        {
            LogError("authInfo->sharedAccessKey input parameter cannot be NULL");
            result = NULL;
        }
        else
        {
            result = malloc(sizeof(IOTHUB_REGISTRYMANAGER));
            if (result == NULL)
            {
                LogError("Malloc failed for IOTHUB_REGISTRYMANAGER");
            }
            else
            {
                memset(result, 0, sizeof(IOTHUB_REGISTRYMANAGER));

                if (mallocAndStrcpy_s(&result->hostname, serviceClientAuth->hostname) != 0)
                {
                    LogError("mallocAndStrcpy_s failed for hostName");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
                else if (mallocAndStrcpy_s(&result->iothubName, serviceClientAuth->iothubName) != 0)
                {
                    LogError("mallocAndStrcpy_s failed for iothubName");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
                else if (mallocAndStrcpy_s(&result->iothubSuffix, serviceClientAuth->iothubSuffix) != 0)
                {
                    LogError("mallocAndStrcpy_s failed for iothubSuffix");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
                else if (mallocAndStrcpy_s(&result->sharedAccessKey, serviceClientAuth->sharedAccessKey) != 0)
                {
                    LogError("mallocAndStrcpy_s failed for sharedAccessKey");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
                else if ((serviceClientAuth->keyName != NULL) && (mallocAndStrcpy_s(&result->keyName, serviceClientAuth->keyName) != 0))
                {
                    LogError("mallocAndStrcpy_s failed for keyName");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
                else if ((serviceClientAuth->deviceId != NULL) && (mallocAndStrcpy_s(&result->deviceId, serviceClientAuth->deviceId) != 0))
                {
                    LogError("mallocAndStrcpy_s failed for deviceId");
                    free_registrymanager_handle(result);
                    result = NULL;
                }
            }
        }
    }
    return result;
}